

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Engine.cpp
# Opt level: O3

void __thiscall adios2::core::Engine::Close(Engine *this,int transportIndex)

{
  long *plVar1;
  size_type *psVar2;
  string local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  (*this->_vptr_Engine[0x84])();
  this->m_IsOpen = false;
  if (transportIndex == -1) {
    std::operator+(&local_38,"freeing comm in Engine ",&this->m_Name);
    plVar1 = (long *)std::__cxx11::string::append((char *)&local_38);
    psVar2 = (size_type *)(plVar1 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar1 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar2) {
      local_58.field_2._M_allocated_capacity = *psVar2;
      local_58.field_2._8_8_ = plVar1[3];
      local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
    }
    else {
      local_58.field_2._M_allocated_capacity = *psVar2;
      local_58._M_dataplus._M_p = (pointer)*plVar1;
    }
    local_58._M_string_length = plVar1[1];
    *plVar1 = (long)psVar2;
    plVar1[1] = 0;
    *(undefined1 *)(plVar1 + 2) = 0;
    helper::Comm::Free(&this->m_Comm,&local_58);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p);
    }
    this->m_IsClosed = true;
  }
  return;
}

Assistant:

void Engine::Close(const int transportIndex)
{
    DoClose(transportIndex);

    m_IsOpen = false;

    if (transportIndex == -1)
    {
        m_Comm.Free("freeing comm in Engine " + m_Name + ", in call to Close");
        m_IsClosed = true;
    }
}